

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O3

string * __thiscall
LatencyDumpDefaultImpl::countToString_abi_cxx11_
          (string *__return_storage_ptr__,LatencyDumpDefaultImpl *this,uint64_t count)

{
  ostream *poVar1;
  double dVar2;
  undefined1 auVar3 [16];
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  if (this < (LatencyDumpDefaultImpl *)0x3e8) {
    std::ostream::_M_insert<unsigned_long>((ulong)&local_188);
  }
  else {
    *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
         *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 1;
    if (this < (LatencyDumpDefaultImpl *)0xf4240) {
      poVar1 = std::ostream::_M_insert<double>((double)(long)this / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"K",1);
    }
    else {
      auVar3._8_4_ = (int)((ulong)this >> 0x20);
      auVar3._0_8_ = this;
      auVar3._12_4_ = 0x45300000;
      dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
      if (this < (LatencyDumpDefaultImpl *)0x3b9aca00) {
        poVar1 = std::ostream::_M_insert<double>(dVar2 / 1000000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"M",1);
      }
      else {
        poVar1 = std::ostream::_M_insert<double>(dVar2 / 1000000000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"B",1);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static std::string countToString(uint64_t count) {
        std::stringstream ss;
        if (count < 1000) {
            ss << count;
        } else if (count < 1000000) {
            // K
            double tmp = static_cast<double>(count / 1000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "K";
        } else if (count < (uint64_t)1000000000) {
            // M
            double tmp = static_cast<double>(count / 1000000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "M";
        } else {
            // B
            double tmp = static_cast<double>(count / 1000000000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "B";
        }
        return ss.str();
    }